

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void C_NewModeAdjust(void)

{
  int width;
  int height;
  
  width = DCanvas::GetWidth((DCanvas *)screen);
  height = DCanvas::GetHeight((DCanvas *)screen);
  C_InitConsole(width,height,true);
  C_FlushDisplay();
  C_AdjustBottom();
  return;
}

Assistant:

void C_NewModeAdjust ()
{
	C_InitConsole (SCREENWIDTH, SCREENHEIGHT, true);
	C_FlushDisplay ();
	C_AdjustBottom ();
}